

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> __thiscall
Lib::
Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,FuncTerm **key)

{
  bool bVar1;
  uint code_00;
  Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
  *in_RSI;
  OptionBase<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> in_RDI;
  Entry *entry;
  uint code;
  FuncTerm *in_stack_ffffffffffffffb8;
  OptionBaseRef<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_*> lhs;
  Entry *local_28;
  
  lhs = in_RDI.super_OptionBaseRef<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_*>
        ._elem;
  code_00 = hashCode((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
                      *)in_RDI.
                        super_OptionBaseRef<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_*>
                        ._elem,(FuncTerm **)in_stack_ffffffffffffffb8);
  local_28 = firstEntryForCode(in_RSI,code_00);
  do {
    bVar1 = Entry::occupied(local_28);
    if (!bVar1) {
      memset(lhs._elem,0,8);
      Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>::Option
                ((Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> *)
                 0x74d5d4);
      return (Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>)
             in_RDI.
             super_OptionBaseRef<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_*>.
             _elem;
    }
    if (local_28->code == code_00) {
      Entry::key(local_28);
      bVar1 = DerefPtrHash<Lib::StlHash>::equals<Kernel::FuncTerm>
                        ((FuncTerm *)lhs._elem,in_stack_ffffffffffffffb8);
      if (bVar1) {
        Entry::value(local_28);
        Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>::OptionBase
                  ((Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> *)
                   lhs._elem,
                   (Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *)in_stack_ffffffffffffffb8)
        ;
        return (Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>)
               in_RDI.
               super_OptionBaseRef<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_*>
               ._elem._elem;
      }
    }
    local_28 = nextEntry(in_RSI,local_28);
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }